

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

_Bool rf_compute_glyph_metrics_from_image
                (rf_image image,rf_color key,int *codepoints,rf_glyph_info *dst,
                rf_int codepoints_and_dst_count)

{
  uint uVar1;
  rf_color rVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  _Bool _Var6;
  int iVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  void *src;
  void *pvVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  long local_98;
  
  _Var6 = (_Bool)((0 < codepoints_and_dst_count && dst != (rf_glyph_info *)0x0) &
                 codepoints != (int *)0x0 & image.valid);
  if (_Var6 == true) {
    uVar1 = rf_bytes_per_pixel(image.format);
    uVar10 = (ulong)uVar1;
    uVar12 = 0;
    uVar19 = 0;
    if (0 < image.width) {
      uVar19 = (ulong)(uint)image.width;
    }
    uVar5 = 0;
    if (0 < image.height) {
      uVar5 = (ulong)(uint)image.height;
    }
    lVar8 = (long)image.width * uVar10;
    uVar16 = 0;
    pvVar13 = image.data;
    for (; uVar12 != uVar5; uVar12 = uVar12 + 1) {
      uVar17 = 0;
      rVar2.r = '\0';
      rVar2.g = '\0';
      rVar2.b = '\0';
      rVar2.a = '\0';
      src = pvVar13;
      while ((uVar16 = uVar19, uVar19 != uVar17 &&
             (rVar2 = rf_format_one_pixel_to_rgba32(src,image.format), uVar16 = uVar17, rVar2 == key
             ))) {
        uVar17 = uVar17 + 1;
        src = (void *)((long)src + uVar10);
        rVar2 = key;
      }
      if (rVar2 != key) {
        uVar5 = uVar12 & 0xffffffff;
        break;
      }
      pvVar13 = (void *)((long)pvVar13 + lVar8);
    }
    iVar3 = (int)uVar5;
    iVar7 = (iVar3 + -1) * image.width;
    pvVar13 = (void *)(((long)iVar3 * (long)image.width + (long)(int)uVar16) * uVar10 +
                      (long)image.data);
    iVar14 = -1;
    do {
      rVar2 = rf_format_one_pixel_to_rgba32(pvVar13,image.format);
      iVar7 = iVar7 + image.width;
      iVar14 = iVar14 + 1;
      pvVar13 = (void *)((long)pvVar13 + lVar8);
    } while (rVar2 != key);
    iVar9 = image.width * iVar3;
    local_98 = 0;
    iVar11 = 0;
    while ((iVar4 = iVar11 * (iVar3 + iVar14) + iVar3, iVar4 < image.height &&
           (local_98 = (long)(int)local_98, local_98 < codepoints_and_dst_count))) {
      uVar12 = uVar16;
      while ((iVar15 = (int)uVar12, iVar15 < image.width &&
             (rVar2 = rf_format_one_pixel_to_rgba32
                                ((void *)((long)(int)((image.width * iVar4 + iVar15) * uVar1) +
                                         (long)image.data),image.format), rVar2 != key))) {
        pvVar13 = (void *)((long)(iVar9 + iVar15) * uVar10 + (long)image.data);
        iVar18 = -1;
        do {
          rVar2 = rf_format_one_pixel_to_rgba32(pvVar13,image.format);
          iVar18 = iVar18 + 1;
          pvVar13 = (void *)((long)pvVar13 + uVar10);
        } while (rVar2 != key);
        dst[local_98].codepoint = codepoints[local_98];
        dst[local_98].field_0.rec.x = (float)iVar15;
        dst[local_98].field_0.rec.y = (float)iVar4;
        dst[local_98].field_0.rec.width = (float)iVar18;
        dst[local_98].field_0.rec.height = (float)iVar14;
        dst[local_98].offset_x = 0;
        dst[local_98].offset_y = 0;
        dst[local_98].advance_x = 0;
        local_98 = local_98 + 1;
        uVar12 = (ulong)(uint)(iVar15 + (int)uVar16 + iVar18);
      }
      iVar11 = iVar11 + 1;
      iVar9 = iVar9 + iVar7;
    }
  }
  return _Var6;
}

Assistant:

RF_API bool rf_compute_glyph_metrics_from_image(rf_image image, rf_color key, const int* codepoints, rf_glyph_info* dst, rf_int codepoints_and_dst_count)
{
    bool result = false;

    if (image.valid && codepoints && dst && codepoints_and_dst_count > 0)
    {
        const int bpp = rf_bytes_per_pixel(image.format);
        const int image_data_size = rf_image_size(image);

        // This macro uses `bpp` and returns the pixel from the image at the index provided by calling rf_format_one_pixel_to_rgba32.
        #define RF_GET_PIXEL(index) rf_format_one_pixel_to_rgba32((char*)image.data + ((index) * bpp), image.format)

        // Parse image data to get char_spacing and line_spacing
        int char_spacing = 0;
        int line_spacing = 0;
        {
            int x = 0;
            int y = 0;
            for (y = 0; y < image.height; y++)
            {
                rf_color pixel = {0};
                for (x = 0; x < image.width; x++)
                {
                    pixel = RF_GET_PIXEL(y * image.width + x);
                    if (!rf_color_match(pixel, key)) break;
                }

                if (!rf_color_match(pixel, key)) break;
            }
            char_spacing = x;
            line_spacing = y;
        }

        // Compute char height
        int char_height = 0;
        {
            while (!rf_color_match(RF_GET_PIXEL((line_spacing + char_height) * image.width + char_spacing), key))
            {
                char_height++;
            }
        }

        // Check array values to get characters: value, x, y, w, h
        int index         = 0;
        int line_to_read  = 0;
        int x_pos_to_read = char_spacing;

        // Parse image data to get rectangle sizes
        while ((line_spacing + line_to_read * (char_height + line_spacing)) < image.height && index < codepoints_and_dst_count)
        {
            while (x_pos_to_read < image.width && !rf_color_match(RF_GET_PIXEL((line_spacing + (char_height + line_spacing) * line_to_read) * image.width + x_pos_to_read), key))
            {
                int char_width = 0;
                while (!rf_color_match(RF_GET_PIXEL(((line_spacing + (char_height + line_spacing) * line_to_read) * image.width + x_pos_to_read + char_width)), key)) {
                    char_width++;
                }

                dst[index].codepoint = codepoints[index];
                dst[index].x         = (float) x_pos_to_read;
                dst[index].y         = (float) (line_spacing + line_to_read * (char_height + line_spacing));
                dst[index].width     = (float) char_width;
                dst[index].height    = (float) char_height;

                // On image based fonts (XNA style), character offsets and x_advance are not required (set to 0)
                dst[index].offset_x  = 0;
                dst[index].offset_y  = 0;
                dst[index].advance_x = 0;

                index++;

                x_pos_to_read += (char_width + char_spacing);
            }

            line_to_read++;
            x_pos_to_read = char_spacing;
        }

        result = true;

        #undef RF_GET_PIXEL
    }

    return result;
}